

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void duckdb_je_arena_cache_bin_fill_small
               (tsdn_t *tsdn,arena_t *arena,cache_bin_t *cache_bin,szind_t binind,
               cache_bin_sz_t nfill)

{
  uint64_t *puVar1;
  atomic_zu_t *paVar2;
  size_t *psVar3;
  pac_decay_stats_t *ppVar4;
  locked_u64_t *plVar5;
  pac_stats_t *ppVar6;
  pa_shard_stats_t *ppVar7;
  void **__dest;
  ulong *puVar8;
  undefined8 *puVar9;
  edata_t *peVar10;
  void **ppvVar11;
  int iVar12;
  undefined8 uVar13;
  batcher_t *batcher;
  edata_list_active_t eVar14;
  _Bool _Var15;
  bool bVar16;
  uint uVar17;
  arena_t *arena_00;
  size_t sVar18;
  long lVar19;
  ulong uVar20;
  uint64_t uVar21;
  char delay_trigger;
  ulong uVar22;
  size_t sVar23;
  bin_t *extraout_RDX;
  bin_t *extraout_RDX_00;
  bin_t *extraout_RDX_01;
  ulong uVar24;
  bin_t *bin;
  bin_t *extraout_RDX_02;
  bin_t *extraout_RDX_03;
  bin_t *extraout_RDX_04;
  bin_t *extraout_RDX_05;
  bin_t *extraout_RDX_06;
  int iVar25;
  edata_t *slab;
  edata_list_active_t *tsdn_00;
  undefined6 in_register_00000082;
  uint i;
  long *plVar26;
  uint cnt;
  ulong uVar27;
  bin_with_batch_t *batched_bin;
  bool bVar28;
  edata_t *local_200;
  uint binshard;
  batcher_t *local_1d8;
  pthread_mutex_t *local_1d0;
  size_t local_1c8;
  size_t local_1c0;
  long local_1b8;
  uint32_t *local_1b0;
  ulong local_1a8;
  long local_1a0;
  arena_bin_flush_batch_state_t batch_flush_state;
  long local_138 [33];
  
  uVar22 = (ulong)binind;
  local_1b8 = -(CONCAT62(in_register_00000082,nfill) & 0xffffffff);
  iVar12 = (int)CONCAT62(in_register_00000082,nfill);
  local_1a0 = (long)cache_bin->stack_head +
              ((ulong)(*(int *)&cache_bin->low_bits_empty - (int)cache_bin->stack_head & 0xffff) -
              (ulong)(uint)(iVar12 * 8));
  local_1a8 = uVar22;
  arena_00 = (arena_t *)duckdb_je_arena_bin_choose(tsdn,arena,binind,&binshard);
  local_1b0 = &duckdb_je_bin_infos[uVar22].nregs;
  local_1d8 = (batcher_t *)&(arena_00->stats).mutex_prof_data[0].max_n_thds;
  local_1d0 = (pthread_mutex_t *)&(arena_00->stats).internal;
  bVar16 = true;
  uVar27 = 0;
  local_200 = (edata_t *)0x0;
  while( true ) {
    malloc_mutex_lock(tsdn,(malloc_mutex_t *)arena_00);
    bin = extraout_RDX;
    if (binind < duckdb_je_bin_info_nbatched_sizes) {
      batch_flush_state.info.div_info.magic = duckdb_je_arena_binind_div_info[local_1a8].magic;
      batch_flush_state.info.nregs = *local_1b0;
      batch_flush_state.info.ndalloc = 0;
      batch_flush_state.dalloc_slab_count = 0;
      batch_flush_state.dalloc_slabs_extra.head.qlh_first =
           (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
      sVar18 = duckdb_je_batcher_pop_begin(tsdn,local_1d8);
      batcher = local_1d8;
      bin = extraout_RDX_00;
      if (sVar18 != 0xffffffffffffffff) {
        local_1c8 = duckdb_je_batcher_pop_get_pushes(tsdn,local_1d8);
        lVar19 = 0;
        sVar23 = sVar18;
        while (bVar28 = sVar23 != 0, sVar23 = sVar23 - 1, bVar28) {
          puVar9 = (undefined8 *)
                   ((long)&(arena_00->stats).mutex_prof_data[2].n_owner_switches + lVar19);
          uVar13 = puVar9[1];
          *(undefined8 *)((long)local_138 + lVar19) = *puVar9;
          *(undefined8 *)((long)local_138 + lVar19 + 8) = uVar13;
          lVar19 = lVar19 + 0x10;
        }
        tsdn_00 = (edata_list_active_t *)tsdn;
        batcher_pop_end(tsdn,batcher);
        plVar26 = local_138 + 1;
        bin = extraout_RDX_01;
        local_1c0 = sVar18;
        while (bVar28 = sVar18 != 0, sVar18 = sVar18 - 1, bVar28) {
          peVar10 = (edata_t *)*plVar26;
          uVar24 = (ulong)batch_flush_state.info.div_info.magic *
                   (plVar26[-1] - (long)peVar10->e_addr);
          bin = (bin_t *)(uVar24 >> 0x26);
          puVar8 = (ulong *)((long)&peVar10->field_6 + (long)bin * 8);
          *puVar8 = *puVar8 ^ 1L << ((byte)(uVar24 >> 0x20) & 0x3f);
          uVar24 = peVar10->e_bits + 0x10000000;
          peVar10->e_bits = uVar24;
          batch_flush_state.info.ndalloc = batch_flush_state.info.ndalloc + 1;
          uVar17 = (uint)(uVar24 >> 0x1c) & 0x3ff;
          if (uVar17 == duckdb_je_bin_infos[uVar22].nregs) {
            duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                      ((tsdn_t *)tsdn_00,arena,peVar10,(bin_t *)arena_00);
            if ((ulong)batch_flush_state.dalloc_slab_count < 8) {
              batch_flush_state.dalloc_slabs[batch_flush_state.dalloc_slab_count] = peVar10;
              batch_flush_state.dalloc_slab_count = batch_flush_state.dalloc_slab_count + 1;
              bin = extraout_RDX_02;
            }
            else {
              tsdn_00 = &batch_flush_state.dalloc_slabs_extra;
              edata_list_active_append(tsdn_00,peVar10);
              bin = extraout_RDX_04;
            }
          }
          else if ((uVar17 == 1) &&
                  ((edata_t *)(arena_00->stats).mutex_prof_data[0].tot_wait_time.ns != peVar10)) {
            duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                      ((tsdn_t *)tsdn_00,arena,peVar10,(bin_t *)arena_00);
            bin = extraout_RDX_03;
          }
          plVar26 = plVar26 + 2;
        }
        paVar2 = &(arena_00->stats).pa_shard_stats.pac_stats.pac_mapped;
        paVar2->repr = paVar2->repr + 1;
        psVar3 = &(arena_00->stats).tcache_bytes;
        *psVar3 = *psVar3 + local_1c8;
        psVar3 = &(arena_00->stats).tcache_stashed_bytes;
        *psVar3 = *psVar3 + local_1c0;
      }
    }
    while( true ) {
      do {
        while( true ) {
          uVar24 = uVar27 & 0xffff;
          iVar25 = (int)uVar24;
          if (nfill <= (ushort)uVar27) goto LAB_00e501f8;
          peVar10 = (edata_t *)(arena_00->stats).mutex_prof_data[0].tot_wait_time.ns;
          if ((peVar10 == (edata_t *)0x0) ||
             (uVar20 = peVar10->e_bits >> 0x1c, uVar17 = (uint)uVar20 & 0x3ff, (uVar20 & 0x3ff) == 0
             )) break;
          cnt = iVar12 - iVar25;
          if (uVar17 <= cnt) {
            cnt = uVar17;
          }
          arena_slab_reg_alloc_batch
                    (peVar10,duckdb_je_bin_infos + uVar22,cnt,(void **)(local_1a0 + uVar24 * 8));
          uVar27 = (ulong)(cnt + iVar25);
          bVar16 = true;
          bin = extraout_RDX_06;
        }
        _Var15 = arena_bin_refill_slabcur_no_fresh_slab((tsdn_t *)arena,arena_00,bin);
        bin = extraout_RDX_05;
      } while (!_Var15);
      if (local_200 == (edata_t *)0x0) break;
      ppVar4 = &(arena_00->stats).pa_shard_stats.pac_stats.decay_muzzy;
      (ppVar4->npurge).val.repr = (ppVar4->npurge).val.repr + 1;
      plVar5 = &(arena_00->stats).pa_shard_stats.pac_stats.decay_muzzy.purged;
      (plVar5->val).repr = (plVar5->val).repr + 1;
      (arena_00->stats).mutex_prof_data[0].tot_wait_time.ns = (uint64_t)local_200;
      local_200 = (edata_t *)0x0;
    }
    if (!bVar16) break;
    if (binind < duckdb_je_bin_info_nbatched_sizes) {
      puVar1 = &(arena_00->stats).nrequests_large;
      *puVar1 = *puVar1 + batch_flush_state.info.ndalloc;
      ppVar6 = &(arena_00->stats).pa_shard_stats.pac_stats;
      (ppVar6->decay_dirty).npurge.val.repr =
           (ppVar6->decay_dirty).npurge.val.repr - batch_flush_state.info.ndalloc;
    }
    *(undefined1 *)&(arena_00->stats).mapped = 0;
    pthread_mutex_unlock(local_1d0);
    if (binind < duckdb_je_bin_info_nbatched_sizes) {
      uVar24 = (ulong)batch_flush_state.dalloc_slab_count;
      for (uVar20 = 0; uVar24 != uVar20; uVar20 = uVar20 + 1) {
        duckdb_je_arena_slab_dalloc
                  (tsdn,(arena_t *)
                        duckdb_je_arenas
                        [(uint)batch_flush_state.dalloc_slabs[uVar20]->e_bits & 0xfff].repr,
                   batch_flush_state.dalloc_slabs[uVar20]);
      }
      while (eVar14.head.qlh_first = batch_flush_state.dalloc_slabs_extra.head.qlh_first,
            batch_flush_state.dalloc_slabs_extra.head.qlh_first != (edata_t *)0x0) {
        edata_list_active_remove
                  (&batch_flush_state.dalloc_slabs_extra,
                   (edata_t *)batch_flush_state.dalloc_slabs_extra.head.qlh_first);
        duckdb_je_arena_slab_dalloc
                  (tsdn,(arena_t *)duckdb_je_arenas[*(uint *)eVar14.head.qlh_first & 0xfff].repr,
                   (edata_t *)eVar14.head.qlh_first);
      }
    }
    local_200 = arena_slab_alloc(tsdn,arena,binind,binshard,duckdb_je_bin_infos + uVar22);
    bVar16 = false;
  }
  local_200 = (edata_t *)0x0;
LAB_00e501f8:
  puVar1 = &(arena_00->stats).nflushes_large;
  *puVar1 = *puVar1 + uVar24;
  ppVar7 = &(arena_00->stats).pa_shard_stats;
  ppVar7->edata_avail = ppVar7->edata_avail + (cache_bin->tstats).nrequests;
  uVar21 = (arena_00->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr + uVar24;
  (arena_00->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr = uVar21;
  plVar5 = &(arena_00->stats).pa_shard_stats.pac_stats.decay_dirty.nmadvise;
  (plVar5->val).repr = (plVar5->val).repr + 1;
  (cache_bin->tstats).nrequests = 0;
  if (binind < duckdb_je_bin_info_nbatched_sizes) {
    puVar1 = &(arena_00->stats).nrequests_large;
    *puVar1 = *puVar1 + batch_flush_state.info.ndalloc;
    (arena_00->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr =
         uVar21 - batch_flush_state.info.ndalloc;
  }
  *(undefined1 *)&(arena_00->stats).mapped = 0;
  pthread_mutex_unlock(local_1d0);
  if (binind < duckdb_je_bin_info_nbatched_sizes) {
    uVar22 = (ulong)batch_flush_state.dalloc_slab_count;
    for (uVar20 = 0; uVar22 != uVar20; uVar20 = uVar20 + 1) {
      duckdb_je_arena_slab_dalloc
                (tsdn,(arena_t *)
                      duckdb_je_arenas[(uint)batch_flush_state.dalloc_slabs[uVar20]->e_bits & 0xfff]
                      .repr,batch_flush_state.dalloc_slabs[uVar20]);
    }
    while (eVar14.head.qlh_first = batch_flush_state.dalloc_slabs_extra.head.qlh_first,
          batch_flush_state.dalloc_slabs_extra.head.qlh_first != (edata_t *)0x0) {
      edata_list_active_remove
                (&batch_flush_state.dalloc_slabs_extra,
                 (edata_t *)batch_flush_state.dalloc_slabs_extra.head.qlh_first);
      duckdb_je_arena_slab_dalloc
                (tsdn,(arena_t *)duckdb_je_arenas[*(uint *)eVar14.head.qlh_first & 0xfff].repr,
                 (edata_t *)eVar14.head.qlh_first);
    }
  }
  if (local_200 != (edata_t *)0x0) {
    duckdb_je_arena_slab_dalloc(tsdn,arena,local_200);
  }
  ppvVar11 = cache_bin->stack_head;
  uVar17 = *(int *)&cache_bin->low_bits_empty - (int)ppvVar11 & 0xffff;
  delay_trigger = -(char)uVar24;
  __dest = (void **)((long)ppvVar11 + uVar24 * -8 + (ulong)uVar17);
  if ((ushort)uVar27 < nfill) {
    lVar19 = local_1b8;
    memmove(__dest,(void *)((long)ppvVar11 + local_1b8 * 8 + (ulong)uVar17),
            (ulong)(uint)(iVar25 << 3));
    delay_trigger = (char)lVar19;
  }
  cache_bin->stack_head = __dest;
  if ((tsdn != (tsdn_t *)0x0) &&
     (_Var15 = ticker_geom_ticks(&(tsdn->tsd).
                                  cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                                 ,&(tsdn->tsd).
                                   cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state,
                                 (uint)('\0' < (tsdn->tsd).
                                               cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level
                                       ),(_Bool)delay_trigger), _Var15)) {
    duckdb_je_arena_decay(tsdn,arena,false,false);
  }
  return;
}

Assistant:

void
arena_cache_bin_fill_small(tsdn_t *tsdn, arena_t *arena,
    cache_bin_t *cache_bin, szind_t binind, const cache_bin_sz_t nfill) {
	assert(cache_bin_ncached_get_local(cache_bin) == 0);
	assert(nfill != 0);

	const bin_info_t *bin_info = &bin_infos[binind];

	CACHE_BIN_PTR_ARRAY_DECLARE(ptrs, nfill);
	cache_bin_init_ptr_array_for_fill(cache_bin, &ptrs, nfill);
	/*
	 * Bin-local resources are used first: 1) bin->slabcur, and 2) nonfull
	 * slabs.  After both are exhausted, new slabs will be allocated through
	 * arena_slab_alloc().
	 *
	 * Bin lock is only taken / released right before / after the while(...)
	 * refill loop, with new slab allocation (which has its own locking)
	 * kept outside of the loop.  This setup facilitates flat combining, at
	 * the cost of the nested loop (through goto label_refill).
	 *
	 * To optimize for cases with contention and limited resources
	 * (e.g. hugepage-backed or non-overcommit arenas), each fill-iteration
	 * gets one chance of slab_alloc, and a retry of bin local resources
	 * after the slab allocation (regardless if slab_alloc failed, because
	 * the bin lock is dropped during the slab allocation).
	 *
	 * In other words, new slab allocation is allowed, as long as there was
	 * progress since the previous slab_alloc.  This is tracked with
	 * made_progress below, initialized to true to jump start the first
	 * iteration.
	 *
	 * In other words (again), the loop will only terminate early (i.e. stop
	 * with filled < nfill) after going through the three steps: a) bin
	 * local exhausted, b) unlock and slab_alloc returns null, c) re-lock
	 * and bin local fails again.
	 */
	bool made_progress = true;
	edata_t *fresh_slab = NULL;
	bool alloc_and_retry = false;
	cache_bin_sz_t filled = 0;
	unsigned binshard;
	bin_t *bin = arena_bin_choose(tsdn, arena, binind, &binshard);

	/*
	 * This has some fields that are conditionally initialized down batch
	 * flush pathways.  This can trigger static analysis warnings deeper
	 * down in the static.  The accesses are guarded by the same checks as
	 * the initialization, but the analysis isn't able to track that across
	 * multiple stack frames.
	 */
	arena_bin_flush_batch_state_t batch_flush_state
	    JEMALLOC_CLANG_ANALYZER_SILENCE_INIT({0});
label_refill:
	malloc_mutex_lock(tsdn, &bin->lock);
	arena_bin_flush_batch_after_lock(tsdn, arena, bin, binind, &batch_flush_state);

	while (filled < nfill) {
		/* Try batch-fill from slabcur first. */
		edata_t *slabcur = bin->slabcur;
		if (slabcur != NULL && edata_nfree_get(slabcur) > 0) {
			unsigned tofill = nfill - filled;
			unsigned nfree = edata_nfree_get(slabcur);
			unsigned cnt = tofill < nfree ? tofill : nfree;

			arena_slab_reg_alloc_batch(slabcur, bin_info, cnt,
			    &ptrs.ptr[filled]);
			made_progress = true;
			filled += cnt;
			continue;
		}
		/* Next try refilling slabcur from nonfull slabs. */
		if (!arena_bin_refill_slabcur_no_fresh_slab(tsdn, arena, bin)) {
			assert(bin->slabcur != NULL);
			continue;
		}

		/* Then see if a new slab was reserved already. */
		if (fresh_slab != NULL) {
			arena_bin_refill_slabcur_with_fresh_slab(tsdn, arena,
			    bin, binind, fresh_slab);
			assert(bin->slabcur != NULL);
			fresh_slab = NULL;
			continue;
		}

		/* Try slab_alloc if made progress (or never did slab_alloc). */
		if (made_progress) {
			assert(bin->slabcur == NULL);
			assert(fresh_slab == NULL);
			alloc_and_retry = true;
			/* Alloc a new slab then come back. */
			break;
		}

		/* OOM. */

		assert(fresh_slab == NULL);
		assert(!alloc_and_retry);
		break;
	} /* while (filled < nfill) loop. */

	if (config_stats && !alloc_and_retry) {
		bin->stats.nmalloc += filled;
		bin->stats.nrequests += cache_bin->tstats.nrequests;
		bin->stats.curregs += filled;
		bin->stats.nfills++;
		cache_bin->tstats.nrequests = 0;
	}

	arena_bin_flush_batch_before_unlock(tsdn, arena, bin, binind,
	    &batch_flush_state);
	malloc_mutex_unlock(tsdn, &bin->lock);
	arena_bin_flush_batch_after_unlock(tsdn, arena, bin, binind,
	    &batch_flush_state);

	if (alloc_and_retry) {
		assert(fresh_slab == NULL);
		assert(filled < nfill);
		assert(made_progress);

		fresh_slab = arena_slab_alloc(tsdn, arena, binind, binshard,
		    bin_info);
		/* fresh_slab NULL case handled in the for loop. */

		alloc_and_retry = false;
		made_progress = false;
		goto label_refill;
	}
	assert(filled == nfill || (fresh_slab == NULL && !made_progress));

	/* Release if allocated but not used. */
	if (fresh_slab != NULL) {
		assert(edata_nfree_get(fresh_slab) == bin_info->nregs);
		arena_slab_dalloc(tsdn, arena, fresh_slab);
		fresh_slab = NULL;
	}

	cache_bin_finish_fill(cache_bin, &ptrs, filled);
	arena_decay_tick(tsdn, arena);
}